

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O1

void __thiscall
QPDF::warn(QPDF *this,qpdf_error_code_e error_code,string *object,qpdf_offset_t offset,
          string *message)

{
  long *plVar1;
  string local_d0;
  QPDFExc local_b0;
  
  plVar1 = (long *)(**(code **)(**(long **)&(((this->m)._M_t.
                                              super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                              .super__Head_base<0UL,_QPDF::Members_*,_false>.
                                             _M_head_impl)->file).
                                            super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>
                               + 0x18))();
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_d0,*plVar1,plVar1[1] + *plVar1);
  QPDFExc::QPDFExc(&local_b0,error_code,&local_d0,object,offset,message);
  warn(this,&local_b0);
  QPDFExc::~QPDFExc(&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void
QPDF::warn(
    qpdf_error_code_e error_code,
    std::string const& object,
    qpdf_offset_t offset,
    std::string const& message)
{
    warn(QPDFExc(error_code, getFilename(), object, offset, message));
}